

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O2

int poll_del(event_base *base,int fd,short old,short events,void *idx_)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  undefined8 uVar8;
  int iVar9;
  ushort uVar10;
  char *pcVar11;
  
  if ((events & 8U) != 0) {
    pcVar11 = "(events & EV_SIGNAL) == 0";
    uVar8 = 0x11d;
LAB_0026d0e3:
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/poll.c"
               ,uVar8,pcVar11,"poll_del");
  }
  iVar9 = 0;
  if ((events & 6U) != 0) {
    iVar2 = *idx_;
    if (iVar2 < 1) {
      iVar9 = -1;
    }
    else {
      pvVar4 = base->evbase;
      uVar6 = (ulong)(iVar2 - 1);
      lVar5 = *(long *)((long)pvVar4 + 0x10);
      if ((events & 2U) != 0) {
        pbVar1 = (byte *)(lVar5 + 4 + uVar6 * 8);
        *pbVar1 = *pbVar1 & 0xfe;
      }
      uVar10 = *(ushort *)(lVar5 + 4 + uVar6 * 8);
      if ((events & 4U) != 0) {
        uVar10 = uVar10 & 0xfffb;
        *(ushort *)(lVar5 + 4 + uVar6 * 8) = uVar10;
      }
      if (uVar10 == 0) {
        *(undefined4 *)idx_ = 0;
        iVar3 = *(int *)((long)pvVar4 + 4);
        *(int *)((long)pvVar4 + 4) = iVar3 + -1;
        iVar9 = 0;
        if (iVar2 != iVar3) {
          *(undefined8 *)(*(long *)((long)pvVar4 + 0x10) + uVar6 * 8) =
               *(undefined8 *)(*(long *)((long)pvVar4 + 0x10) + -8 + (long)iVar3 * 8);
          piVar7 = (int *)evmap_io_get_fdinfo_
                                    (&base->io,*(int *)(*(long *)((long)pvVar4 + 0x10) + uVar6 * 8))
          ;
          if (piVar7 == (int *)0x0) {
            pcVar11 = "idx";
            uVar8 = 0x13d;
          }
          else {
            if (*piVar7 == *(int *)((long)pvVar4 + 4) + 1) {
              *piVar7 = iVar2;
              return 0;
            }
            pcVar11 = "idx->idxplus1 == pop->nfds + 1";
            uVar8 = 0x13e;
          }
          goto LAB_0026d0e3;
        }
      }
    }
  }
  return iVar9;
}

Assistant:

static int
poll_del(struct event_base *base, int fd, short old, short events, void *idx_)
{
	struct pollop *pop = base->evbase;
	struct pollfd *pfd = NULL;
	struct pollidx *idx = idx_;
	int i;

	EVUTIL_ASSERT((events & EV_SIGNAL) == 0);
	if (!(events & (EV_READ|EV_WRITE)))
		return (0);

	poll_check_ok(pop);
	i = idx->idxplus1 - 1;
	if (i < 0)
		return (-1);

	/* Do we still want to read or write? */
	pfd = &pop->event_set[i];
	if (events & EV_READ)
		pfd->events &= ~POLLIN;
	if (events & EV_WRITE)
		pfd->events &= ~POLLOUT;
	poll_check_ok(pop);
	if (pfd->events)
		/* Another event cares about that fd. */
		return (0);

	/* Okay, so we aren't interested in that fd anymore. */
	idx->idxplus1 = 0;

	--pop->nfds;
	if (i != pop->nfds) {
		/*
		 * Shift the last pollfd down into the now-unoccupied
		 * position.
		 */
		memcpy(&pop->event_set[i], &pop->event_set[pop->nfds],
		       sizeof(struct pollfd));
		idx = evmap_io_get_fdinfo_(&base->io, pop->event_set[i].fd);
		EVUTIL_ASSERT(idx);
		EVUTIL_ASSERT(idx->idxplus1 == pop->nfds + 1);
		idx->idxplus1 = i + 1;
	}

	poll_check_ok(pop);
	return (0);
}